

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgradientreconstruction.cpp
# Opt level: O1

void __thiscall
TPZGradientReconstruction::TPZGradientData::ComputeWeights(TPZGradientData *this,REAL paramk)

{
  long lVar1;
  int iVar2;
  double *pdVar3;
  TPZGeoEl *pTVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  REAL __x;
  double dVar8;
  TPZManVector<double,_3> centerneigh;
  TPZManVector<double,_3> nodecelX;
  TPZManVector<double,_30> dist;
  double local_1c8;
  double local_1b8;
  TPZManVector<double,_3> local_1b0;
  TPZManVector<double,_3> local_178;
  TPZManVector<double,_30> local_140;
  
  if ((paramk < 1.0) || (2.0 < paramk)) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzgradientreconstruction.cpp"
               ,0x43a);
  }
  TPZManVector<double,_3>::TPZManVector(&local_178,0);
  NodeCloserCenterX(this,&local_178);
  lVar5 = (this->fCelAndNeighbors).super_TPZManVector<TPZCompEl_*,_10>.super_TPZVec<TPZCompEl_*>.
          fNElements;
  lVar7 = lVar5 + -1;
  local_1b0.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_30>::TPZManVector(&local_140,lVar7,(double *)&local_1b0);
  local_1b8 = 0.0;
  TPZManVector<double,_3>::TPZManVector(&local_1b0,3,&local_1b8);
  local_1c8 = 0.0;
  if (1 < lVar5) {
    local_1c8 = 0.0;
    lVar5 = 0;
    do {
      pTVar4 = TPZCompEl::Reference
                         ((this->fCelAndNeighbors).super_TPZManVector<TPZCompEl_*,_10>.
                          super_TPZVec<TPZCompEl_*>.fStore[lVar5 + 1]);
      if (pTVar4 == (TPZGeoEl *)0x0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzgradientreconstruction.cpp"
                   ,0x449);
      }
      lVar1 = lVar5 + 1;
      iVar2 = this->fdim;
      if (0 < (long)iVar2) {
        pdVar3 = (this->fCenterPointCellAndNeighbors).
                 super_TPZManVector<TPZManVector<double,_3>,_10>.
                 super_TPZVec<TPZManVector<double,_3>_>.fStore[lVar1].super_TPZVec<double>.fStore;
        lVar6 = 0;
        do {
          local_1b0.super_TPZVec<double>.fStore[lVar6] = pdVar3[lVar6];
          lVar6 = lVar6 + 1;
        } while (iVar2 != lVar6);
      }
      __x = TPZGeoEl::Distance(&local_1b0.super_TPZVec<double>,&local_178.super_TPZVec<double>);
      local_140.super_TPZVec<double>.fStore[lVar5] = __x;
      dVar8 = pow(__x,paramk);
      local_1c8 = local_1c8 + 1.0 / dVar8;
      lVar5 = lVar1;
    } while (lVar1 != lVar7);
  }
  local_1b8 = 0.0;
  TPZManVector<double,_3>::Resize
            (&this->fWeightsGrad,local_140.super_TPZVec<double>.fNElements,&local_1b8);
  if (0 < local_140.super_TPZVec<double>.fNElements) {
    lVar7 = 0;
    do {
      dVar8 = pow(local_140.super_TPZVec<double>.fStore[lVar7],paramk);
      dVar8 = (1.0 / dVar8) / local_1c8;
      (this->fWeightsGrad).super_TPZVec<double>.fStore[lVar7] = dVar8;
      if ((dVar8 < 0.0) || (1.0 < dVar8)) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzgradientreconstruction.cpp"
                   ,0x459);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < local_140.super_TPZVec<double>.fNElements);
  }
  TPZManVector<double,_3>::~TPZManVector(&local_1b0);
  if (local_140.super_TPZVec<double>.fStore == local_140.fExtAlloc) {
    local_140.super_TPZVec<double>.fStore = (double *)0x0;
  }
  local_140.super_TPZVec<double>.fNAlloc = 0;
  local_140.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_140.super_TPZVec<double>.fStore != (double *)0x0) {
    operator_delete__(local_140.super_TPZVec<double>.fStore);
  }
  TPZManVector<double,_3>::~TPZManVector(&local_178);
  return;
}

Assistant:

void TPZGradientReconstruction::TPZGradientData::ComputeWeights(REAL paramk)
{
    
    if(paramk<1 || paramk>2) DebugStop();
    
    TPZManVector<REAL,3> nodecelX;
    
    //Node more closer of the cel barycenter
    NodeCloserCenterX(nodecelX);
    
    int64_t nneighs = fCelAndNeighbors.size()-1;
    TPZManVector<REAL,30> dist(nneighs,0.);
    TPZManVector<REAL,3> centerneigh(3,0.0);
    
    REAL sum=0.;
    for(int in = 0; in < nneighs; in++)
    {
        TPZGeoEl * gel = fCelAndNeighbors[in+1]->Reference();
        if(!gel) DebugStop();
        
        for(int k=0; k<fdim; k++) centerneigh[k]=fCenterPointCellAndNeighbors[in+1][k];
        
        dist[in]=gel->Distance(centerneigh, nodecelX);
        
        sum += 1./pow((REAL)dist[in],paramk);
    }
    
    fWeightsGrad.Resize(dist.size(), 0.);
    REAL temp;
    
    for (int id = 0; id<dist.size(); id++)
    {
        temp = 1./pow((REAL)dist[id],paramk);
        fWeightsGrad[id] = temp/sum;
        if(fWeightsGrad[id]<0 || fWeightsGrad[id]>1) DebugStop();
    }
}